

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-fs-copyfile.c
# Opt level: O1

void handle_result(uv_fs_t *req)

{
  long lVar1;
  long lVar2;
  int iVar3;
  uv_fs_t *unaff_RBX;
  undefined8 in_R9;
  int64_t eval_b;
  int64_t eval_b_2;
  uv_fs_t stat_req;
  long local_1e0 [15];
  long local_168;
  long local_138;
  
  local_1e0[0] = (long)req->fs_type;
  if (local_1e0[0] == 0x1e) {
    local_1e0[0] = req->result;
    unaff_RBX = req;
    if (local_1e0[0] != 0) goto LAB_0018769b;
    iVar3 = uv_fs_stat(0,local_1e0,req->path,0);
    lVar2 = local_138;
    lVar1 = local_168;
    if (iVar3 != 0) goto LAB_001876aa;
    uv_fs_req_cleanup(local_1e0);
    iVar3 = uv_fs_stat(0,local_1e0,"test_file_dst",0);
    if (iVar3 != 0) goto LAB_001876b9;
    if (local_138 == lVar2) {
      if (local_168 == lVar1) {
        uv_fs_req_cleanup(local_1e0);
        uv_fs_req_cleanup(req);
        result_check_count = result_check_count + 1;
        return;
      }
      goto LAB_001876d7;
    }
  }
  else {
    handle_result_cold_1();
LAB_0018769b:
    handle_result_cold_2();
LAB_001876aa:
    handle_result_cold_3();
LAB_001876b9:
    handle_result_cold_4();
  }
  handle_result_cold_5();
LAB_001876d7:
  handle_result_cold_6();
  fprintf(_stderr,"Fatal error in %s on line %d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-fs-copyfile.c"
          ,0x2c,"fail_cb should not have been called",in_R9,unaff_RBX);
  fflush(_stderr);
  abort();
}

Assistant:

static void handle_result(uv_fs_t* req) {
  uv_fs_t stat_req;
  uint64_t size;
  uint64_t mode;
  int r;

  ASSERT_EQ(req->fs_type, UV_FS_COPYFILE);
  ASSERT_OK(req->result);

  /* Verify that the file size and mode are the same. */
  r = uv_fs_stat(NULL, &stat_req, req->path, NULL);
  ASSERT_OK(r);
  size = stat_req.statbuf.st_size;
  mode = stat_req.statbuf.st_mode;
  uv_fs_req_cleanup(&stat_req);
  r = uv_fs_stat(NULL, &stat_req, dst, NULL);
  ASSERT_OK(r);
  ASSERT_EQ(stat_req.statbuf.st_size, size);
  ASSERT_EQ(stat_req.statbuf.st_mode, mode);
  uv_fs_req_cleanup(&stat_req);
  uv_fs_req_cleanup(req);
  result_check_count++;
}